

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall MeshDenoisingViaL0Minimization::denoise(MeshDenoisingViaL0Minimization *this)

{
  uint *edge_vertex_handle_00;
  ParameterSet *pPVar1;
  bool bVar2;
  string *this_00;
  MeshDenoisingViaL0Minimization *this_01;
  undefined1 local_330 [8];
  TriMesh mesh;
  vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
  edge_vertex_handle;
  undefined1 auStack_e8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  coef;
  undefined1 auStack_c8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> delta;
  double local_a8;
  double mu_beta;
  double beta_max;
  double mu_alpha;
  double lambda;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  area_based_edge_operator;
  double local_68;
  double alpha;
  double beta;
  MatrixXd initial_vertices_matrix;
  
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_330,
             &((this->super_MeshDenoisingBase).data_manager_)->noisy_mesh_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)&beta,"mu_beta",(allocator *)&lambda);
    bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&local_a8);
    std::__cxx11::string::~string((string *)&beta);
    if (bVar2) {
      pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
      std::__cxx11::string::string((string *)&beta,"beta",(allocator *)&lambda);
      bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&alpha);
      std::__cxx11::string::~string((string *)&beta);
      if (bVar2) {
        pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
        std::__cxx11::string::string((string *)&beta,"beta_max",(allocator *)&lambda);
        bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&mu_beta);
        std::__cxx11::string::~string((string *)&beta);
        if (bVar2) {
          pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
          std::__cxx11::string::string((string *)&beta,"mu_alpha",(allocator *)&lambda);
          bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&beta_max);
          std::__cxx11::string::~string((string *)&beta);
          if (bVar2) {
            pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
            std::__cxx11::string::string((string *)&beta,"alpha",(allocator *)&lambda);
            bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&local_68);
            std::__cxx11::string::~string((string *)&beta);
            if (bVar2) {
              pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
              std::__cxx11::string::string((string *)&beta,"lambda",(allocator *)&lambda);
              bVar2 = ParameterSet::getValue(pPVar1,(string *)&beta,&mu_alpha);
              this_00 = (string *)&beta;
              std::__cxx11::string::~string(this_00);
              if (bVar2) {
                beta = 0.0;
                initial_vertices_matrix.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
                     (double *)0x0;
                initial_vertices_matrix.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
                     0;
                getInitialVerticesMatrix
                          ((MeshDenoisingViaL0Minimization *)this_00,(TriMesh *)local_330,
                           (MatrixXd *)&beta);
                area_based_edge_operator.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                lambda = 0.0;
                area_based_edge_operator.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                edge_vertex_handle_00 =
                     &mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      .refcount_fcolors_;
                mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_fcolors_ = 0;
                mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_ftextureIndex_ = 0;
                auStack_e8 = (undefined1  [8])0x0;
                coef.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                coef.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                delta.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                auStack_c8 = (undefined1  [8])0x0;
                delta.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                for (; alpha < mu_beta; alpha = local_a8 * alpha) {
                  this_01 = this;
                  calculateAreaBasedEdgeOperator
                            (this,(TriMesh *)local_330,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)&lambda,
                             (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                              *)edge_vertex_handle_00,
                             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)auStack_e8);
                  solveDelta(this_01,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&lambda,mu_alpha,alpha,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)auStack_c8);
                  solveVertices(this_01,(TriMesh *)local_330,(MatrixXd *)&beta,
                                (vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                                 *)edge_vertex_handle_00,
                                (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)auStack_e8,
                                (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)auStack_c8,local_68,alpha);
                  local_68 = beta_max * local_68;
                }
                OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             *)&((this->super_MeshDenoisingBase).data_manager_)->mesh_,
                            (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             *)local_330);
                OpenMesh::
                AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ::operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             *)&((this->super_MeshDenoisingBase).data_manager_)->denoised_mesh_,
                            (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             *)local_330);
                std::
                _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)auStack_c8);
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)auStack_e8);
                std::
                vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                           *)&mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              .refcount_fcolors_);
                std::
                _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 *)&lambda);
                free((void *)beta);
              }
            }
          }
        }
      }
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_330);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameters
    double mu_beta, beta, beta_max;
    if(!parameter_set_->getValue(string("mu_beta"), mu_beta))
        return;
    if(!parameter_set_->getValue(string("beta"), beta))
        return;
    if(!parameter_set_->getValue(string("beta_max"), beta_max))
        return;
    double mu_alpha, alpha;
    if(!parameter_set_->getValue(string("mu_alpha"), mu_alpha))
        return;
    if(!parameter_set_->getValue(string("alpha"), alpha))
        return;
    double lambda;
    if(!parameter_set_->getValue(string("lambda"), lambda))
        return;

    // do optimization
    Eigen::MatrixXd initial_vertices_matrix;
    getInitialVerticesMatrix(mesh, initial_vertices_matrix);

    std::vector<TriMesh::Point> area_based_edge_operator;
    std::vector< std::vector<TriMesh::VertexHandle> > edge_vertex_handle;
    std::vector< std::vector<double> > coef;
    std::vector<TriMesh::Point> delta;

    while(beta < beta_max){
        calculateAreaBasedEdgeOperator(mesh, area_based_edge_operator, edge_vertex_handle, coef);
        // update delta
        solveDelta(area_based_edge_operator, lambda, beta, delta);
        // update vertices
        solveVertices(mesh, initial_vertices_matrix, edge_vertex_handle, coef, delta, alpha, beta);
        beta *= mu_beta;
        alpha *= mu_alpha;
    }

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}